

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_view_pool.hpp
# Opt level: O1

void __thiscall
libtorrent::aux::file_view_entry::file_view_entry
          (file_view_entry *this,file_id k,string_view name,open_mode_t m,int64_t size)

{
  time_point tVar1;
  undefined1 local_39;
  file_handle local_38;
  bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void> local_34;
  int64_t local_30;
  
  this->key = k;
  local_34.m_val = m.m_val;
  local_30 = size;
  file_handle::file_handle(&local_38,name,size,m);
  ::std::__shared_ptr<libtorrent::aux::file_mapping,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<libtorrent::aux::file_mapping>,libtorrent::aux::file_handle,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::aux::open_mode_tag,void>const&,long_const&>
            ((__shared_ptr<libtorrent::aux::file_mapping,(__gnu_cxx::_Lock_policy)2> *)
             &this->mapping,(allocator<libtorrent::aux::file_mapping> *)&local_39,&local_38,
             &local_34,&local_30);
  file_handle::~file_handle(&local_38);
  tVar1 = time_now();
  (this->last_use).__d.__r = (rep)tVar1.__d.__r;
  (this->mode).m_val = local_34.m_val;
  return;
}

Assistant:

file_view_entry(file_id k
			, string_view name
			, open_mode_t const m
			, std::int64_t const size
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
			, std::shared_ptr<std::mutex> open_unmap_lock
#endif
			)
			: key(k)
			, mapping(std::make_shared<file_mapping>(file_handle(name, size, m), m, size
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
				, open_unmap_lock
#endif
				))
			, mode(m)
		{}